

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

HelicsPublication helicsFederateGetPublication(HelicsFederate fed,char *key,HelicsError *err)

{
  size_t sVar1;
  Publication *pub;
  HelicsPublication pvVar2;
  string_view name;
  shared_ptr<helics::ValueFederate> fedObj;
  ValueFederate *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  getValueFedSharedPtr(&local_30,(HelicsError *)fed);
  if (local_30 != (ValueFederate *)0x0) {
    sVar1 = strlen(key);
    name._M_str = key;
    name._M_len = sVar1;
    pub = helics::ValueFederate::getPublication(local_30,name);
    if ((pub->super_Interface).handle.hid != -1700000000) {
      pvVar2 = anon_unknown.dwarf_7c49a::findOrCreatePublication(fed,pub);
      goto LAB_001a41a4;
    }
    if (err != (HelicsError *)0x0) {
      err->error_code = -4;
      err->message = "the specified publication name is a not a valid publication name";
    }
  }
  pvVar2 = (HelicsPublication)0x0;
LAB_001a41a4:
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return pvVar2;
}

Assistant:

HelicsPublication helicsFederateGetPublication(HelicsFederate fed, const char* key, HelicsError* err)
{
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    try {
        auto& pub = fedObj->getPublication(key);
        if (!pub.isValid()) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidPubName);
            return nullptr;
        }
        return findOrCreatePublication(fed, pub);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
    // LCOV_EXCL_STOP
}